

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_set.hpp
# Opt level: O2

set<char,_std::greater<void>,_std::allocator<char>_> * __thiscall
burst::make_set<char,std::forward_list<char,std::allocator<char>>const&,std::greater<void>>
          (set<char,_std::greater<void>,_std::allocator<char>_> *__return_storage_ptr__,burst *this,
          forward_list<char,_std::allocator<char>_> *values,greater<void> *compare)

{
  allocator_type local_9;
  
  std::set<char,std::greater<void>,std::allocator<char>>::set<std::_Fwd_list_const_iterator<char>>
            ((set<char,std::greater<void>,std::allocator<char>> *)__return_storage_ptr__,
             *(_Fwd_list_node_base **)this,(_Fwd_list_const_iterator<char>)0x0,
             (greater<void> *)values,&local_9);
  return __return_storage_ptr__;
}

Assistant:

auto make_set (InputRange && values, const Compare & compare)
    {
        using std::begin;
        using std::end;
        return
            std::set<Value, Compare>
            (
                begin(std::forward<InputRange>(values)),
                end(std::forward<InputRange>(values)),
                compare
            );
    }